

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore_posix.cpp
# Opt level: O0

void __thiscall
QSystemSemaphorePosix::cleanHandle(QSystemSemaphorePosix *this,QSystemSemaphorePrivate *self)

{
  long lVar1;
  int iVar2;
  char *__name;
  int *piVar3;
  char *in_RSI;
  QSystemSemaphorePrivate *in_RDI;
  long in_FS_OFFSET;
  QByteArray semName;
  undefined1 in_stack_00000120 [16];
  QNativeIpcKey *in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  QSystemSemaphorePrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  if ((in_RDI->nativeKey).d != (QNativeIpcKeyPrivate *)0x0) {
    iVar2 = sem_close((sem_t *)(in_RDI->nativeKey).d);
    if (iVar2 == -1) {
      Qt::Literals::StringLiterals::operator____L1
                (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      QSystemSemaphorePrivate::setUnixErrorString(this_00,(QLatin1StringView)in_stack_00000120);
    }
    (in_RDI->nativeKey).d = (QNativeIpcKeyPrivate *)0x0;
  }
  if (((ulong)(in_RDI->nativeKey).key.d.d & 1) != 0) {
    QNativeIpcKey::nativeKey(in_stack_ffffffffffffff48);
    QFile::encodeName((QString *)in_stack_ffffffffffffff48);
    QString::~QString((QString *)0x8d4cbf);
    __name = QByteArray::operator_cast_to_char_((QByteArray *)0x8d4ccc);
    iVar2 = sem_unlink(__name);
    if (iVar2 == -1) {
      piVar3 = __errno_location();
      if (*piVar3 != 2) {
        Qt::Literals::StringLiterals::operator____L1(in_RSI,in_stack_ffffffffffffff50);
        QSystemSemaphorePrivate::setUnixErrorString(this_00,(QLatin1StringView)in_stack_00000120);
      }
    }
    *(undefined1 *)&(in_RDI->nativeKey).key.d.d = 0;
    QByteArray::~QByteArray((QByteArray *)0x8d4d82);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSystemSemaphorePosix::cleanHandle(QSystemSemaphorePrivate *self)
{
    if (semaphore != SEM_FAILED) {
        if (::sem_close(semaphore) == -1) {
            self->setUnixErrorString("QSystemSemaphore::cleanHandle (sem_close)"_L1);
#if defined QSYSTEMSEMAPHORE_DEBUG
            qDebug("QSystemSemaphore::cleanHandle sem_close failed.");
#endif
        }
        semaphore = SEM_FAILED;
    }

    if (createdSemaphore) {
        const QByteArray semName = QFile::encodeName(self->nativeKey.nativeKey());
        if (::sem_unlink(semName) == -1 && errno != ENOENT) {
            self->setUnixErrorString("QSystemSemaphore::cleanHandle (sem_unlink)"_L1);
#if defined QSYSTEMSEMAPHORE_DEBUG
            qDebug("QSystemSemaphorePosix::cleanHandle sem_unlink failed.");
#endif
        }
        createdSemaphore = false;
    }
}